

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathOp.cpp
# Opt level: O0

void __thiscall MathOp::Raw_Tanh::back(Raw_Tanh *this)

{
  bool bVar1;
  Mat *a;
  Mat *in_RDI;
  Mat *in_stack_fffffffffffffec8;
  ll128 *in_stack_fffffffffffffed0;
  Mat *in_stack_fffffffffffffed8;
  Mat *in_stack_fffffffffffffee0;
  Mat *in_stack_fffffffffffffee8;
  ll128 *in_stack_ffffffffffffff10;
  Mat *in_stack_ffffffffffffff18;
  
  *(int *)&(in_RDI->val).super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
           super__Vector_impl_data._M_start =
       *(int *)&(in_RDI->val).super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                super__Vector_impl_data._M_start + 1;
  bVar1 = NeuronMat::getIsBack
                    ((NeuronMat *)
                     (in_RDI->val).super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  if (!bVar1) {
    NeuronMat::getForward(*(NeuronMat **)(in_RDI + 1));
    Mat::operator+(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    a = NeuronMat::getForward(*(NeuronMat **)(in_RDI + 1));
    Mat::oneMinus_IE(in_stack_fffffffffffffec8);
    Mat::dot(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    Mat::operator/(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    NeuronMat::getGrad((NeuronMat *)
                       (in_RDI->val).super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage);
    Mat::operator=(in_RDI,a);
    Mat::~Mat((Mat *)0x134859);
    Mat::~Mat((Mat *)0x134866);
    Mat::~Mat((Mat *)0x134873);
    Mat::~Mat((Mat *)0x134880);
    NeuronMat::getGrad((NeuronMat *)
                       (in_RDI->val).super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage);
    NeuronMat::getGrad(*(NeuronMat **)(in_RDI + 1));
    Mat::dot(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    Mat::operator/(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    NeuronMat::getGrad((NeuronMat *)
                       (in_RDI->val).super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage);
    Mat::operator=(in_RDI,a);
    Mat::~Mat((Mat *)0x134911);
    Mat::~Mat((Mat *)0x13491b);
  }
  return;
}

Assistant:

void MathOp::Raw_Tanh::back(){
    backRound++;
    if (!a->getIsBack()){
        *a->getGrad()=(*res->getForward()+IE).dot(res->getForward()->oneMinus_IE())/IE;
        *a->getGrad()=a->getGrad()->dot(*res->getGrad())/IE;

    }
}